

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_qhttpnetworkreply_p.cpp
# Opt level: O1

void QHttpNetworkReply::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  long *plVar1;
  offset_in_QHttpNetworkReply_to_subr *candidate;
  undefined8 *puVar2;
  undefined4 uVar3;
  void **ppvVar4;
  InterfaceType *pIVar5;
  int iVar6;
  long in_FS_OFFSET;
  QArrayData *local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined4 local_4c;
  void *local_48;
  undefined4 *puStack_40;
  undefined1 *local_38;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  if (_c == RegisterMethodArgumentMetaType) {
    switch(_id) {
    case 1:
      puVar2 = (undefined8 *)*_a;
      if (*_a[1] == 0) {
        pIVar5 = &QtPrivate::QMetaTypeInterfaceWrapper<QList<QSslError>_>::metaType;
LAB_0020e913:
        *puVar2 = pIVar5;
        goto LAB_0020eabd;
      }
      break;
    case 2:
      puVar2 = (undefined8 *)*_a;
      if (*_a[1] == 0) {
        pIVar5 = &QtPrivate::QMetaTypeInterfaceWrapper<QSslPreSharedKeyAuthenticator_*>::metaType;
        goto LAB_0020e913;
      }
      break;
    default:
      puVar2 = (undefined8 *)*_a;
      break;
    case 7:
    case 8:
      puVar2 = (undefined8 *)*_a;
      if (*_a[1] == 0) {
        pIVar5 = &QtPrivate::QMetaTypeInterfaceWrapper<QNetworkReply::NetworkError>::metaType;
        goto LAB_0020e913;
      }
      break;
    case 0xc:
    case 0xe:
      puVar2 = (undefined8 *)*_a;
      if (*_a[1] == 0) {
        pIVar5 = &QtPrivate::QMetaTypeInterfaceWrapper<QHttpNetworkRequest>::metaType;
        goto LAB_0020e913;
      }
    }
    *puVar2 = 0;
    goto LAB_0020eabd;
  }
  if (_c == IndexOfMethod) {
    plVar1 = (long *)_a[1];
    if ((((((((code *)*plVar1 == encrypted) && (uVar3 = 0, plVar1[1] == 0)) ||
           (((code *)*plVar1 == sslErrors && (uVar3 = 1, plVar1[1] == 0)))) ||
          (((code *)*plVar1 == preSharedKeyAuthenticationRequired && (uVar3 = 2, plVar1[1] == 0))))
         || ((((code *)*plVar1 == socketStartedConnecting && (uVar3 = 3, plVar1[1] == 0)) ||
             ((((code *)*plVar1 == requestSent && (uVar3 = 4, plVar1[1] == 0)) ||
              (((code *)*plVar1 == readyRead && (uVar3 = 5, plVar1[1] == 0)))))))) ||
        ((((code *)*plVar1 == finished && (uVar3 = 6, plVar1[1] == 0)) ||
         (((code *)*plVar1 == finishedWithError && (uVar3 = 7, plVar1[1] == 0)))))) ||
       ((((((code *)*plVar1 == headerChanged && (uVar3 = 9, plVar1[1] == 0)) ||
          (((code *)*plVar1 == dataReadProgress && (uVar3 = 10, plVar1[1] == 0)))) ||
         ((((code *)*plVar1 == dataSendProgress && (uVar3 = 0xb, plVar1[1] == 0)) ||
          (((code *)*plVar1 == cacheCredentials && (uVar3 = 0xc, plVar1[1] == 0)))))) ||
        (((((code *)*plVar1 == proxyAuthenticationRequired && (uVar3 = 0xd, plVar1[1] == 0)) ||
          (((code *)*plVar1 == authenticationRequired && (uVar3 = 0xe, plVar1[1] == 0)))) ||
         (((code *)*plVar1 == redirected && (uVar3 = 0xf, plVar1[1] == 0)))))))) {
      *(undefined4 *)*_a = uVar3;
    }
    goto LAB_0020eabd;
  }
  if (_c != InvokeMetaMethod) goto LAB_0020eabd;
  switch(_id) {
  case 0:
    iVar6 = 0;
    goto LAB_0020e88e;
  case 1:
    puStack_40 = (undefined4 *)_a[1];
    ppvVar4 = &local_48;
    local_48 = (void *)0x0;
    iVar6 = 1;
    break;
  case 2:
    local_68 = *_a[1];
    ppvVar4 = &local_48;
    local_48 = (void *)0x0;
    iVar6 = 2;
    puStack_40 = (undefined4 *)&local_68;
    break;
  case 3:
    iVar6 = 3;
    goto LAB_0020e88e;
  case 4:
    iVar6 = 4;
    goto LAB_0020e88e;
  case 5:
    iVar6 = 5;
    goto LAB_0020e88e;
  case 6:
    iVar6 = 6;
    goto LAB_0020e88e;
  case 7:
    local_38 = (undefined1 *)_a[2];
    local_68 = (QArrayData *)CONCAT44(local_68._4_4_,*_a[1]);
    ppvVar4 = &local_48;
    local_48 = (void *)0x0;
    iVar6 = 7;
    puStack_40 = (undefined4 *)&local_68;
    break;
  case 8:
    local_4c = *_a[1];
    local_58 = 0;
    local_68 = (QArrayData *)0x0;
    uStack_60 = 0;
    puStack_40 = &local_4c;
    local_48 = (void *)0x0;
    local_38 = (undefined1 *)&local_68;
    QMetaObject::activate(_o,&staticMetaObject,7,&local_48);
    if (local_68 != (QArrayData *)0x0) {
      LOCK();
      (local_68->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_68->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_68->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(local_68,2,0x10);
      }
    }
    goto LAB_0020eabd;
  case 9:
    iVar6 = 9;
LAB_0020e88e:
    ppvVar4 = (void **)0x0;
    break;
  case 10:
    dataReadProgress((QHttpNetworkReply *)_o,*_a[1],*_a[2]);
    goto LAB_0020eabd;
  case 0xb:
    dataSendProgress((QHttpNetworkReply *)_o,*_a[1],*_a[2]);
    goto LAB_0020eabd;
  case 0xc:
    local_68 = *_a[2];
    ppvVar4 = &local_48;
    local_48 = (void *)0x0;
    iVar6 = 0xc;
    puStack_40 = (undefined4 *)_a[1];
    local_38 = (undefined1 *)&local_68;
    break;
  case 0xd:
    local_68 = *_a[2];
    ppvVar4 = &local_48;
    local_48 = (void *)0x0;
    iVar6 = 0xd;
    puStack_40 = (undefined4 *)_a[1];
    local_38 = (undefined1 *)&local_68;
    break;
  case 0xe:
    local_68 = *_a[2];
    ppvVar4 = &local_48;
    local_48 = (void *)0x0;
    iVar6 = 0xe;
    puStack_40 = (undefined4 *)_a[1];
    local_38 = (undefined1 *)&local_68;
    break;
  case 0xf:
    redirected((QHttpNetworkReply *)_o,(QUrl *)_a[1],*_a[2],*_a[3]);
  default:
    goto LAB_0020eabd;
  }
  QMetaObject::activate(_o,&staticMetaObject,iVar6,ppvVar4);
LAB_0020eabd:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QHttpNetworkReply::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    auto *_t = static_cast<QHttpNetworkReply *>(_o);
    if (_c == QMetaObject::InvokeMetaMethod) {
        switch (_id) {
        case 0: _t->encrypted(); break;
        case 1: _t->sslErrors((*reinterpret_cast< std::add_pointer_t<QList<QSslError>>>(_a[1]))); break;
        case 2: _t->preSharedKeyAuthenticationRequired((*reinterpret_cast< std::add_pointer_t<QSslPreSharedKeyAuthenticator*>>(_a[1]))); break;
        case 3: _t->socketStartedConnecting(); break;
        case 4: _t->requestSent(); break;
        case 5: _t->readyRead(); break;
        case 6: _t->finished(); break;
        case 7: _t->finishedWithError((*reinterpret_cast< std::add_pointer_t<QNetworkReply::NetworkError>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<QString>>(_a[2]))); break;
        case 8: _t->finishedWithError((*reinterpret_cast< std::add_pointer_t<QNetworkReply::NetworkError>>(_a[1]))); break;
        case 9: _t->headerChanged(); break;
        case 10: _t->dataReadProgress((*reinterpret_cast< std::add_pointer_t<qint64>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<qint64>>(_a[2]))); break;
        case 11: _t->dataSendProgress((*reinterpret_cast< std::add_pointer_t<qint64>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<qint64>>(_a[2]))); break;
        case 12: _t->cacheCredentials((*reinterpret_cast< std::add_pointer_t<QHttpNetworkRequest>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<QAuthenticator*>>(_a[2]))); break;
        case 13: _t->proxyAuthenticationRequired((*reinterpret_cast< std::add_pointer_t<QNetworkProxy>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<QAuthenticator*>>(_a[2]))); break;
        case 14: _t->authenticationRequired((*reinterpret_cast< std::add_pointer_t<QHttpNetworkRequest>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<QAuthenticator*>>(_a[2]))); break;
        case 15: _t->redirected((*reinterpret_cast< std::add_pointer_t<QUrl>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<int>>(_a[2])),(*reinterpret_cast< std::add_pointer_t<int>>(_a[3]))); break;
        default: ;
        }
    }
    if (_c == QMetaObject::RegisterMethodArgumentMetaType) {
        switch (_id) {
        default: *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType(); break;
        case 1:
            switch (*reinterpret_cast<int*>(_a[1])) {
            default: *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType(); break;
            case 0:
                *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType::fromType< QList<QSslError> >(); break;
            }
            break;
        case 2:
            switch (*reinterpret_cast<int*>(_a[1])) {
            default: *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType(); break;
            case 0:
                *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType::fromType< QSslPreSharedKeyAuthenticator* >(); break;
            }
            break;
        case 7:
            switch (*reinterpret_cast<int*>(_a[1])) {
            default: *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType(); break;
            case 0:
                *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType::fromType< QNetworkReply::NetworkError >(); break;
            }
            break;
        case 8:
            switch (*reinterpret_cast<int*>(_a[1])) {
            default: *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType(); break;
            case 0:
                *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType::fromType< QNetworkReply::NetworkError >(); break;
            }
            break;
        case 12:
            switch (*reinterpret_cast<int*>(_a[1])) {
            default: *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType(); break;
            case 0:
                *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType::fromType< QHttpNetworkRequest >(); break;
            }
            break;
        case 14:
            switch (*reinterpret_cast<int*>(_a[1])) {
            default: *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType(); break;
            case 0:
                *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType::fromType< QHttpNetworkRequest >(); break;
            }
            break;
        }
    }
    if (_c == QMetaObject::IndexOfMethod) {
        if (QtMocHelpers::indexOfMethod<void (QHttpNetworkReply::*)()>(_a, &QHttpNetworkReply::encrypted, 0))
            return;
        if (QtMocHelpers::indexOfMethod<void (QHttpNetworkReply::*)(const QList<QSslError> & )>(_a, &QHttpNetworkReply::sslErrors, 1))
            return;
        if (QtMocHelpers::indexOfMethod<void (QHttpNetworkReply::*)(QSslPreSharedKeyAuthenticator * )>(_a, &QHttpNetworkReply::preSharedKeyAuthenticationRequired, 2))
            return;
        if (QtMocHelpers::indexOfMethod<void (QHttpNetworkReply::*)()>(_a, &QHttpNetworkReply::socketStartedConnecting, 3))
            return;
        if (QtMocHelpers::indexOfMethod<void (QHttpNetworkReply::*)()>(_a, &QHttpNetworkReply::requestSent, 4))
            return;
        if (QtMocHelpers::indexOfMethod<void (QHttpNetworkReply::*)()>(_a, &QHttpNetworkReply::readyRead, 5))
            return;
        if (QtMocHelpers::indexOfMethod<void (QHttpNetworkReply::*)()>(_a, &QHttpNetworkReply::finished, 6))
            return;
        if (QtMocHelpers::indexOfMethod<void (QHttpNetworkReply::*)(QNetworkReply::NetworkError , const QString & )>(_a, &QHttpNetworkReply::finishedWithError, 7))
            return;
        if (QtMocHelpers::indexOfMethod<void (QHttpNetworkReply::*)()>(_a, &QHttpNetworkReply::headerChanged, 9))
            return;
        if (QtMocHelpers::indexOfMethod<void (QHttpNetworkReply::*)(qint64 , qint64 )>(_a, &QHttpNetworkReply::dataReadProgress, 10))
            return;
        if (QtMocHelpers::indexOfMethod<void (QHttpNetworkReply::*)(qint64 , qint64 )>(_a, &QHttpNetworkReply::dataSendProgress, 11))
            return;
        if (QtMocHelpers::indexOfMethod<void (QHttpNetworkReply::*)(const QHttpNetworkRequest & , QAuthenticator * )>(_a, &QHttpNetworkReply::cacheCredentials, 12))
            return;
        if (QtMocHelpers::indexOfMethod<void (QHttpNetworkReply::*)(const QNetworkProxy & , QAuthenticator * )>(_a, &QHttpNetworkReply::proxyAuthenticationRequired, 13))
            return;
        if (QtMocHelpers::indexOfMethod<void (QHttpNetworkReply::*)(const QHttpNetworkRequest & , QAuthenticator * )>(_a, &QHttpNetworkReply::authenticationRequired, 14))
            return;
        if (QtMocHelpers::indexOfMethod<void (QHttpNetworkReply::*)(const QUrl & , int , int )>(_a, &QHttpNetworkReply::redirected, 15))
            return;
    }
}